

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaLoader::StoreAnimations(ColladaLoader *this,aiScene *pScene,ColladaParser *pParser)

{
  aiAnimation *paVar1;
  bool bVar2;
  long *plVar3;
  aiScene *paVar4;
  iterator iVar5;
  aiAnimation *paVar6;
  long *plVar7;
  aiNodeAnim **ppaVar8;
  unsigned_long *puVar9;
  undefined1 *puVar10;
  ulong uVar11;
  aiAnimation **__dest;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  pointer ppaVar14;
  pointer __src;
  uint uVar15;
  pointer ppaVar16;
  ulong uVar17;
  size_t __n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> collectedAnimIndices;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  animTargets;
  string channelName;
  unsigned_long *local_4e8;
  iterator iStack_4e0;
  unsigned_long *local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4c0;
  long *local_4b8;
  ulong local_4b0;
  long local_4a8;
  long lStack_4a0;
  long *local_498;
  ulong local_490;
  long local_488 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_478;
  aiScene *local_448;
  char *local_440;
  string local_438 [32];
  
  local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"");
  StoreAnimations(this,pScene,pParser,&pParser->mAnims,local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
    operator_delete(local_438[0]._M_dataplus._M_p,local_438[0].field_2._M_allocated_capacity + 1);
  }
  ppaVar16 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppaVar14 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppaVar14 != ppaVar16) {
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    local_448 = pScene;
    do {
      paVar1 = ppaVar16[(long)paVar13];
      if (paVar1->mNumChannels == 1) {
        local_4e8 = (unsigned_long *)0x0;
        iStack_4e0._M_current = (unsigned_long *)0x0;
        local_4d8 = (unsigned_long *)0x0;
        local_438[0]._M_dataplus._M_p = paVar13->_M_local_buf + 1;
        local_4c8 = paVar13;
        local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_438[0]._M_dataplus._M_p;
        if (local_438[0]._M_dataplus._M_p < (undefined1 *)((long)ppaVar14 - (long)ppaVar16 >> 3)) {
          do {
            paVar6 = ppaVar16[(long)local_438[0]._M_dataplus._M_p];
            if (paVar6->mNumChannels == 1) {
              if ((paVar6->mDuration == paVar1->mDuration) &&
                 (!NAN(paVar6->mDuration) && !NAN(paVar1->mDuration))) {
                if ((paVar6->mTicksPerSecond == paVar1->mTicksPerSecond) &&
                   (!NAN(paVar6->mTicksPerSecond) && !NAN(paVar1->mTicksPerSecond))) {
                  if (iStack_4e0._M_current == local_4d8) {
                    std::vector<unsigned_long,std::allocator<unsigned_long>>::
                    _M_realloc_insert<unsigned_long_const&>
                              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_4e8,
                               iStack_4e0,(unsigned_long *)local_438);
                  }
                  else {
                    *iStack_4e0._M_current = (unsigned_long)local_438[0]._M_dataplus._M_p;
                    iStack_4e0._M_current = iStack_4e0._M_current + 1;
                  }
                }
              }
            }
            local_438[0]._M_dataplus._M_p = local_438[0]._M_dataplus._M_p + 1;
            ppaVar16 = (this->mAnims).
                       super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
          } while (local_438[0]._M_dataplus._M_p <
                   (char *)((long)(this->mAnims).
                                  super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)ppaVar16 >> 3));
        }
        local_478._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_478._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_478._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_478._M_impl.super__Rb_tree_header._M_header;
        local_478._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_478._M_impl.super__Rb_tree_header._M_header._M_right =
             local_478._M_impl.super__Rb_tree_header._M_header._M_left;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_438,((*paVar1->mChannels)->mNodeName).data,
                   (allocator<char> *)&local_4b8);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_478,local_438);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
          operator_delete(local_438[0]._M_dataplus._M_p,
                          local_438[0].field_2._M_allocated_capacity + 1);
        }
        if (iStack_4e0._M_current == local_4e8) {
LAB_00414acd:
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_478);
        }
        else {
          bVar2 = true;
          uVar17 = 0;
          do {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_438,
                       ((*(this->mAnims).
                          super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                          super__Vector_impl_data._M_start[local_4e8[uVar17]]->mChannels)->mNodeName
                       ).data,(allocator<char> *)&local_4b8);
            iVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&local_478,local_438);
            if ((_Rb_tree_header *)iVar5._M_node == &local_478._M_impl.super__Rb_tree_header) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_478,local_438);
            }
            else {
              bVar2 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
              operator_delete(local_438[0]._M_dataplus._M_p,
                              local_438[0].field_2._M_allocated_capacity + 1);
            }
          } while (((_Rb_tree_header *)iVar5._M_node == &local_478._M_impl.super__Rb_tree_header) &&
                  (uVar17 = uVar17 + 1,
                  uVar17 < (ulong)((long)iStack_4e0._M_current - (long)local_4e8 >> 3)));
          if (bVar2) {
            if (local_4e8 != iStack_4e0._M_current) {
              paVar6 = (aiAnimation *)operator_new(0x448);
              (paVar6->mName).length = 0;
              (paVar6->mName).data[0] = '\0';
              memset((paVar6->mName).data + 1,0x1b,0x3ff);
              paVar6->mDuration = -1.0;
              paVar6->mTicksPerSecond = 0.0;
              paVar6->mNumChannels = 0;
              paVar6->mChannels = (aiNodeAnim **)0x0;
              paVar6->mNumMeshChannels = 0;
              paVar6->mMeshChannels = (aiMeshAnim **)0x0;
              paVar6->mNumMorphMeshChannels = 0;
              paVar6->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
              local_498 = local_488;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_498,"combinedAnim_","");
              plVar7 = (long *)std::__cxx11::string::_M_replace_aux
                                         ((ulong)&local_498,local_490,0,'\x01');
              plVar12 = plVar7 + 2;
              if ((long *)*plVar7 == plVar12) {
                local_4a8 = *plVar12;
                lStack_4a0 = plVar7[3];
                local_4b8 = &local_4a8;
              }
              else {
                local_4a8 = *plVar12;
                local_4b8 = (long *)*plVar7;
              }
              plVar3 = local_4b8;
              local_440 = (paVar6->mName).data;
              local_4b0 = plVar7[1];
              *plVar7 = (long)plVar12;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              __n = local_4b0 & 0xffffffff;
              if ((local_4b0 & 0xfffffc00) != 0) {
                __n = 0x3ff;
              }
              local_438[0]._M_dataplus._M_p._0_4_ = (ai_uint32)__n;
              memcpy((void *)((long)&local_438[0]._M_dataplus._M_p + 4),local_4b8,__n);
              *(undefined1 *)((long)&local_438[0]._M_dataplus._M_p + __n + 4) = 0;
              (paVar6->mName).length = (ai_uint32)__n;
              memcpy(local_440,(void *)((long)&local_438[0]._M_dataplus._M_p + 4),__n);
              (paVar6->mName).data[__n] = '\0';
              if (plVar3 != &local_4a8) {
                operator_delete(plVar3,local_4a8 + 1);
              }
              if (local_498 != local_488) {
                operator_delete(local_498,local_488[0] + 1);
              }
              paVar6->mDuration = paVar1->mDuration;
              paVar6->mTicksPerSecond = paVar1->mTicksPerSecond;
              uVar15 = (int)((ulong)((long)iStack_4e0._M_current - (long)local_4e8) >> 3) + 1;
              paVar6->mNumChannels = uVar15;
              ppaVar8 = (aiNodeAnim **)operator_new__((ulong)uVar15 << 3);
              paVar6->mChannels = ppaVar8;
              *ppaVar8 = *paVar1->mChannels;
              *paVar1->mChannels = (aiNodeAnim *)0x0;
              aiAnimation::~aiAnimation(paVar1);
              operator_delete(paVar1,0x448);
              (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
              _M_impl.super__Vector_impl_data._M_start[(long)local_4c8] = paVar6;
              if (iStack_4e0._M_current != local_4e8) {
                uVar17 = 0;
                do {
                  paVar1 = (this->mAnims).
                           super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl
                           .super__Vector_impl_data._M_start[local_4e8[uVar17]];
                  paVar6->mChannels[uVar17 + 1] = *paVar1->mChannels;
                  uVar17 = uVar17 + 1;
                  *paVar1->mChannels = (aiNodeAnim *)0x0;
                  aiAnimation::~aiAnimation(paVar1);
                  operator_delete(paVar1,0x448);
                } while (uVar17 < (ulong)((long)iStack_4e0._M_current - (long)local_4e8 >> 3));
                if (local_4e8 != iStack_4e0._M_current) {
                  ppaVar14 = (this->mAnims).
                             super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                  puVar9 = local_4e8;
                  do {
                    ppaVar16 = (this->mAnims).
                               super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                    __src = ppaVar16 + iStack_4e0._M_current[-1] + 1;
                    if (__src != ppaVar14) {
                      memmove(ppaVar16 + iStack_4e0._M_current[-1],__src,
                              (long)ppaVar14 - (long)__src);
                      ppaVar14 = (this->mAnims).
                                 super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
                      puVar9 = local_4e8;
                    }
                    ppaVar14 = ppaVar14 + -1;
                    (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish = ppaVar14;
                    iStack_4e0._M_current = iStack_4e0._M_current + -1;
                  } while (puVar9 != iStack_4e0._M_current);
                }
              }
            }
            goto LAB_00414acd;
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_478);
        }
        paVar13 = local_4c0;
        if (local_4e8 != (unsigned_long *)0x0) {
          operator_delete(local_4e8,(long)local_4d8 - (long)local_4e8);
          paVar13 = local_4c0;
        }
      }
      else {
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar13->_M_local_buf + 1);
      }
      paVar4 = local_448;
      ppaVar16 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppaVar14 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      puVar10 = (undefined1 *)((long)ppaVar14 - (long)ppaVar16 >> 3);
    } while (paVar13 < puVar10);
    if (ppaVar16 != ppaVar14) {
      local_448->mNumAnimations = (uint)puVar10;
      uVar11 = (long)(this->mAnims).
                     super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->mAnims).
                     super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar17 = 0xffffffffffffffff;
      if (-1 < (long)uVar11) {
        uVar17 = uVar11;
      }
      __dest = (aiAnimation **)operator_new__(uVar17);
      paVar4->mAnimations = __dest;
      ppaVar16 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppaVar14 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if ((long)ppaVar14 - (long)ppaVar16 == 0) {
        return;
      }
      memmove(__dest,ppaVar16,(long)ppaVar14 - (long)ppaVar16);
    }
  }
  if (ppaVar14 != ppaVar16) {
    (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppaVar16;
  }
  return;
}

Assistant:

void ColladaLoader::StoreAnimations( aiScene* pScene, const ColladaParser& pParser) {
    // recursively collect all animations from the collada scene
    StoreAnimations(pScene, pParser, &pParser.mAnims, "");

    // catch special case: many animations with the same length, each affecting only a single node.
    // we need to unite all those single-node-anims to a proper combined animation
    for(size_t a = 0; a < mAnims.size(); ++a) {
        aiAnimation* templateAnim = mAnims[a];

        if (templateAnim->mNumChannels == 1) {
            // search for other single-channel-anims with the same duration
            std::vector<size_t> collectedAnimIndices;
            for( size_t b = a+1; b < mAnims.size(); ++b) {
                aiAnimation* other = mAnims[b];
                if (other->mNumChannels == 1 && other->mDuration == templateAnim->mDuration &&
                    other->mTicksPerSecond == templateAnim->mTicksPerSecond)
						collectedAnimIndices.push_back(b);
            }

			// We only want to combine the animations if they have different channels
			std::set<std::string> animTargets;
			animTargets.insert(templateAnim->mChannels[0]->mNodeName.C_Str());
			bool collectedAnimationsHaveDifferentChannels = true;
			for (size_t b = 0; b < collectedAnimIndices.size(); ++b)
			{
				aiAnimation* srcAnimation = mAnims[collectedAnimIndices[b]];
				std::string channelName = std::string(srcAnimation->mChannels[0]->mNodeName.C_Str());
				if (animTargets.find(channelName) == animTargets.end()) {
					animTargets.insert(channelName);
				} else {
					collectedAnimationsHaveDifferentChannels = false;
					break;
				}
			}

			if (!collectedAnimationsHaveDifferentChannels)
				continue;

            // if there are other animations which fit the template anim, combine all channels into a single anim
            if (!collectedAnimIndices.empty())
            {
                aiAnimation* combinedAnim = new aiAnimation();
                combinedAnim->mName = aiString(std::string("combinedAnim_") + char('0' + a));
                combinedAnim->mDuration = templateAnim->mDuration;
                combinedAnim->mTicksPerSecond = templateAnim->mTicksPerSecond;
                combinedAnim->mNumChannels = static_cast<unsigned int>(collectedAnimIndices.size() + 1);
                combinedAnim->mChannels = new aiNodeAnim*[combinedAnim->mNumChannels];
                // add the template anim as first channel by moving its aiNodeAnim to the combined animation
                combinedAnim->mChannels[0] = templateAnim->mChannels[0];
                templateAnim->mChannels[0] = NULL;
                delete templateAnim;
                // combined animation replaces template animation in the anim array
                mAnims[a] = combinedAnim;

                // move the memory of all other anims to the combined anim and erase them from the source anims
                for (size_t b = 0; b < collectedAnimIndices.size(); ++b)
                {
                    aiAnimation* srcAnimation = mAnims[collectedAnimIndices[b]];
                    combinedAnim->mChannels[1 + b] = srcAnimation->mChannels[0];
                    srcAnimation->mChannels[0] = NULL;
                    delete srcAnimation;
                }

                // in a second go, delete all the single-channel-anims that we've stripped from their channels
                // back to front to preserve indices - you know, removing an element from a vector moves all elements behind the removed one
                while (!collectedAnimIndices.empty())
                {
                    mAnims.erase(mAnims.begin() + collectedAnimIndices.back());
                    collectedAnimIndices.pop_back();
                }
            }
        }
    }

    // now store all anims in the scene
    if (!mAnims.empty())
    {
        pScene->mNumAnimations = static_cast<unsigned int>(mAnims.size());
        pScene->mAnimations = new aiAnimation*[mAnims.size()];
        std::copy(mAnims.begin(), mAnims.end(), pScene->mAnimations);
    }

    mAnims.clear();
}